

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::add(NaPetriNet *this,NaPetriNode *pNode)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  NaPetriConnector *pNVar5;
  NaPetriNode *in_RSI;
  NaPetriNet *in_RDI;
  NaPetriConnector *pCn_1;
  int i_1;
  int nOutputs;
  NaPetriConnector *pCn;
  int i;
  int nInputs;
  int in_stack_ffffffffffffff4c;
  NaPetriNode *in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff58;
  NaDynAr<NaPetriNode_*> *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  FILE *pFVar6;
  NaPetriNode *in_stack_ffffffffffffff70;
  NaPetriNet *in_stack_ffffffffffffff78;
  int local_28;
  int local_24;
  int local_18;
  int local_14;
  
  bVar1 = ask_for_node(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                      );
  if (!bVar1) {
    if ((in_RDI->fpDig != (FILE *)0x0) &&
       (iVar2 = NaPetriNode::connectors((NaPetriNode *)0x15bad7), 0 < iVar2)) {
      pFVar6 = (FILE *)in_RDI->fpDig;
      pcVar3 = NaPetriNode::name(in_RSI);
      pcVar4 = NaPetriNode::name(in_RSI);
      fprintf(pFVar6,"  %s [\n    label=\"%s|{",pcVar3,pcVar4);
      local_14 = 0;
      for (local_18 = 0; iVar2 = NaPetriNode::connectors((NaPetriNode *)0x15bb5c), local_18 < iVar2;
          local_18 = local_18 + 1) {
        pNVar5 = NaPetriNode::connector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        iVar2 = (*pNVar5->_vptr_NaPetriConnector[7])();
        if (iVar2 == 0) {
          if (local_14 == 0) {
            pFVar6 = (FILE *)in_RDI->fpDig;
            pcVar3 = NaPetriConnector::name(pNVar5);
            pcVar4 = NaPetriConnector::name(pNVar5);
            fprintf(pFVar6,"{<%s>%s",pcVar3,pcVar4);
          }
          else {
            pFVar6 = (FILE *)in_RDI->fpDig;
            pcVar3 = NaPetriConnector::name(pNVar5);
            pcVar4 = NaPetriConnector::name(pNVar5);
            fprintf(pFVar6,"|<%s>%s",pcVar3,pcVar4);
          }
          local_14 = local_14 + 1;
        }
      }
      if (0 < local_14) {
        fprintf((FILE *)in_RDI->fpDig,"}");
      }
      local_24 = 0;
      for (local_28 = 0; iVar2 = NaPetriNode::connectors((NaPetriNode *)0x15bcc7), local_28 < iVar2;
          local_28 = local_28 + 1) {
        pNVar5 = NaPetriNode::connector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        iVar2 = (*pNVar5->_vptr_NaPetriConnector[7])();
        if (iVar2 == 1) {
          if ((local_24 == 0) && (local_14 == 0)) {
            pFVar6 = (FILE *)in_RDI->fpDig;
            pcVar3 = NaPetriConnector::name(pNVar5);
            pcVar4 = NaPetriConnector::name(pNVar5);
            fprintf(pFVar6,"{<%s>%s",pcVar3,pcVar4);
          }
          else if (local_24 == 0) {
            pFVar6 = (FILE *)in_RDI->fpDig;
            pcVar3 = NaPetriConnector::name(pNVar5);
            pcVar4 = NaPetriConnector::name(pNVar5);
            fprintf(pFVar6,"|{<%s>%s",pcVar3,pcVar4);
          }
          else {
            in_stack_ffffffffffffff58 = (FILE *)in_RDI->fpDig;
            in_stack_ffffffffffffff60 = (NaDynAr<NaPetriNode_*> *)NaPetriConnector::name(pNVar5);
            pcVar3 = NaPetriConnector::name(pNVar5);
            fprintf(in_stack_ffffffffffffff58,"|<%s>%s",in_stack_ffffffffffffff60,pcVar3);
          }
          local_24 = local_24 + 1;
        }
      }
      if (0 < local_24) {
        fprintf((FILE *)in_RDI->fpDig,"}");
      }
      fprintf((FILE *)in_RDI->fpDig,"}\"\n  ] ;\n");
    }
    pcVar3 = name(in_RDI);
    pcVar4 = NaPetriNode::name(in_RSI);
    NaPrintLog(" %s: + %s node\n",pcVar3,pcVar4);
    NaDynAr<NaPetriNode_*>::addh
              (in_stack_ffffffffffffff60,(NaPetriNode **)in_stack_ffffffffffffff58);
    in_RSI->pNet = in_RDI;
    (*in_RSI->_vptr_NaPetriNode[10])();
  }
  return;
}

Assistant:

void
NaPetriNet::add (NaPetriNode* pNode)
{
    if(ask_for_node(pNode)){
        // Don't add the same node twice
        return;
    }

    if(NULL != fpDig) {
	if(pNode->connectors() > 0) {
	    fprintf(fpDig, "  %s [\n    label=\"%s|{",
		    pNode->name(), pNode->name());
	    int nInputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckInput == pCn->kind()) {
		    if(0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nInputs;
		}
	    }
	    if(nInputs > 0)
		fprintf(fpDig, "}");
	    int nOutputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckOutput == pCn->kind()) {
		    if(0 == nOutputs && 0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else if(0 == nOutputs)
			fprintf(fpDig, "|{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nOutputs;
		}
	    }
	    if(nOutputs > 0)
		fprintf(fpDig, "}");
	    fprintf(fpDig, "}\"\n  ] ;\n");
	}
    }

    NaPrintLog(" %s: + %s node\n", name(), pNode->name());

    pnaNet.addh(pNode);

    // Setup pointer to the network
    pNode->pNet = this;

    // Perform some actions in new attendee
    pNode->attend_network();
}